

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.h
# Opt level: O0

void __thiscall aiString::Append(aiString *this,char *app)

{
  int iVar1;
  size_t sVar2;
  ai_uint32 len;
  char *app_local;
  aiString *this_local;
  
  sVar2 = strlen(app);
  iVar1 = (int)sVar2;
  if ((iVar1 != 0) && (this->length + iVar1 < 0x400)) {
    memcpy(this->data + this->length,app,(ulong)(iVar1 + 1));
    this->length = iVar1 + this->length;
  }
  return;
}

Assistant:

void Append (const char* app)   {
        const ai_uint32 len = (ai_uint32) ::strlen(app);
        if (!len) {
            return;
        }
        if (length + len >= MAXLEN) {
            return;
        }

        memcpy(&data[length],app,len+1);
        length += len;
    }